

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

char __thiscall
Fl_Preferences::get(Fl_Preferences *this,char *key,char *text,char *defaultValue,int maxSize)

{
  char *pcVar1;
  char *w;
  char *v;
  int maxSize_local;
  char *defaultValue_local;
  char *text_local;
  char *key_local;
  Fl_Preferences *this_local;
  
  w = Node::get(this->node,key);
  if ((w != (char *)0x0) && (pcVar1 = strchr(w,0x5c), pcVar1 != (char *)0x0)) {
    pcVar1 = decodeText(w);
    fl_strlcpy(text,pcVar1,(long)maxSize);
    free(pcVar1);
    return '\x01';
  }
  if (w == (char *)0x0) {
    w = defaultValue;
  }
  if (w == (char *)0x0) {
    *text = '\0';
  }
  else {
    fl_strlcpy(text,w,(long)maxSize);
  }
  return w != defaultValue;
}

Assistant:

char Fl_Preferences::get( const char *key, char *text, const char *defaultValue, int maxSize ) {
  const char *v = node->get( key );
  if ( v && strchr( v, '\\' ) ) {
    char *w = decodeText( v );
    strlcpy(text, w, maxSize);
    free( w );
    return 1;
  }
  if ( !v ) v = defaultValue;
  if ( v ) strlcpy(text, v, maxSize);
  else *text = 0;
  return ( v != defaultValue );
}